

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertObj(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,int i_obj)

{
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  QuadTerms *this_01;
  pointer pBVar1;
  LinkEntry be;
  int iVar2;
  Type s;
  undefined4 extraout_var;
  ValueNode *pVVar4;
  size_t index;
  ulong uVar5;
  ExprBase e;
  NodeRange NVar6;
  NodeRange NVar7;
  int i_obj_local;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  ValueNode *local_560;
  NodeIndexRange NStack_558;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_550;
  LinTerms le;
  string local_4c8;
  EExpr qpnew;
  EExpr eexpr;
  ArrayRef<int> local_f8;
  LinearObjective lo;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar3;
  
  iVar2 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])();
  pBVar3 = (BasicProblem<mp::BasicProblemParams<int>_> *)CONCAT44(extraout_var,iVar2);
  local_550.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       pBVar3;
  local_550.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ = i_obj;
  pVVar4 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                     (&(this->flat_cvt_).
                       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       .value_presolver_.super_ValuePresolverImpl.src_.objs_);
  NVar6 = pre::ValueNode::Add(pVVar4,1);
  pVVar4 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                     (&(this->flat_cvt_).
                       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       .value_presolver_.super_ValuePresolverImpl.dest_.objs_);
  NVar7 = pre::ValueNode::Add(pVVar4,1);
  local_560 = NVar7.pvn_;
  NStack_558 = NVar7.ir_;
  be.second.pvn_ = local_560;
  be.first = NVar6;
  be.second.ir_ = NStack_558;
  pre::CopyLink::AddEntry
            (&(this->flat_cvt_).
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .copy_link_,be);
  this_00 = &this->flat_cvt_;
  (this->flat_cvt_).
  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  .auto_link_src_item_ = NVar6;
  uVar5 = (ulong)i_obj;
  auto_link_scope.cvt_ = this_00;
  ToLinTerms(&le,(pBVar3->linear_objs_).
                 super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar5);
  pBVar1 = (pBVar3->nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(pBVar3->nonlinear_objs_).
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    e.impl_ = pBVar1[uVar5].super_ExprBase.impl_;
  }
  else {
    e.impl_ = (Impl *)0x0;
  }
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression(&eexpr.super_QuadraticExpr);
  if (e.impl_ != (Impl *)0x0) {
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit(&qpnew,(BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
                    *)this,(Expr)e.impl_);
    AlgebraicExpression<mp::QuadAndLinTerms>::operator=
              (&eexpr.super_QuadraticExpr,&qpnew.super_QuadraticExpr);
    QuadAndLinTerms::~QuadAndLinTerms(&qpnew.super_QuadraticExpr.super_QuadAndLinTerms);
    LinTerms::add(&le,(LinTerms *)&eexpr.super_QuadraticExpr);
    if ((eexpr.super_QuadraticExpr.constant_term_ != 0.0) ||
       (NAN(eexpr.super_QuadraticExpr.constant_term_))) {
      NVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::MakeFixedVar(&this_00->
                              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             ,eexpr.super_QuadraticExpr.constant_term_);
      LinTerms::add_term(&le,1.0,NVar6.ir_.beg_);
    }
  }
  LinTerms::sort_terms(&le,true);
  this_01 = &eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms;
  QuadTerms::sort_terms(this_01);
  if (((this->flat_cvt_).
       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .options_.passQuadObj_ == 0) &&
     (eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0)) {
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression(&qpnew.super_QuadraticExpr);
    QuadTerms::operator=(&qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms,this_01);
    iVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::Convert2Var(&this_00->
                           super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          ,&qpnew.super_QuadraticExpr);
    eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    eexpr.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    LinTerms::add_term(&le,1.0,iVar2);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)&qpnew);
  }
  s = BasicProblem<mp::BasicProblemParams<int>_>::
      BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
      ::type(&local_550);
  qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)0x0;
  qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 0;
  qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0] =
       (type)le.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  qpnew.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1] =
       (type)le.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  local_f8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.data_ =
       le.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  local_f8.size_ =
       le.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8._M_string_length = 0;
  local_4c8.field_2._M_local_buf[0] = '\0';
  LinearObjective::LinearObjective<mp::ArrayRef<double>,mp::ArrayRef<int>>
            (&lo,s,(ArrayRef<double> *)&qpnew,&local_f8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&qpnew);
  QuadraticObjective::QuadraticObjective((QuadraticObjective *)&qpnew,&lo,this_01);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddObjective(&this_00->
                  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ,(QuadraticObjective *)&qpnew);
  QuadraticObjective::~QuadraticObjective((QuadraticObjective *)&qpnew);
  LinearObjective::~LinearObjective(&lo);
  QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)&eexpr);
  LinTerms::~LinTerms(&le);
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&auto_link_scope);
  return;
}

Assistant:

void ConvertObj(int i_obj) {
    try {
      typename ProblemType::MutObjective obj = GetModel().obj(i_obj);
      auto obj_src =              // source value node for this obj
          GetValuePresolver().GetSourceNodes().GetObjValues()().Add();
      GetCopyLink().AddEntry(
          {
           obj_src,
           GetValuePresolver().GetTargetNodes().GetObjValues()().Add() });
      /// After the CopyLink, add One2ManyLink for converted expressions.
      /// When postsolving, CopyLink is executed last and copies obj values.
      /// This should resolve the issue of the "max-out"
      /// value conflict resolution.
      /// Tested by suf_common/funcpieces_01_01_obj.mod.
      pre::AutoLinkScope<FlatConverterType> auto_link_scope{
          GetFlatCvt(), obj_src
      };
      auto le = ToLinTerms(obj.linear_expr());
      NumericExpr e = obj.nonlinear_expr();
      EExpr eexpr;
      if (e) {
        eexpr=MP_DISPATCH( Visit(e) );
        le.add(eexpr.GetLinTerms());
        if (std::fabs(eexpr.constant_term())!=0.0) {
          /// Not using objective constant, should we?
          le.add_term(1.0, MakeFixedVar(eexpr.constant_term()));
        }
      }
      /// Sort/merge terms, otherwise we lose repeated terms
      /// in Gurobi where we just set 'obj attributes'
      /// to variables.
      /// Context is propagated after adding all objectives.
      le.sort_terms();
      eexpr.GetQPTerms().sort_terms();
      if (!GetFlatCvt().IfPassQuadObj()            // SCIP 10
          && eexpr.GetQPTerms().size()) {
        EExpr qpnew;
        qpnew.GetQPTerms() = std::move(eexpr.GetQPTerms());
        int qpres = Convert2Var(std::move(qpnew));
        eexpr.GetQPTerms().clear();                // explicitly remove obj qp terms
        le.add_term(1.0, qpres);
      }
      /// Add linear / quadratic obj
      LinearObjective lo { obj.type(),
                         std::move(le.coefs()), std::move(le.vars()) };
      GetFlatCvt().AddObjective(
          QuadraticObjective{std::move(lo),
                             std::move(eexpr.GetQPTerms())});
    } catch (const std::exception& exc) {
      MP_RAISE(fmt::format(
          "Error flattening objective _obj[{}]:\n  {}", i_obj, exc.what()));
    }
  }